

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_with_concurrent_updates_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *meta;
  fdb_iterator *in_stack_fffffffffffffac8;
  fdb_file_handle *in_stack_fffffffffffffad0;
  fdb_iterator *in_stack_fffffffffffffad8;
  size_t in_stack_fffffffffffffaf0;
  fdb_doc **in_stack_fffffffffffffb40;
  fdb_iterator *in_stack_fffffffffffffb48;
  undefined1 local_4b0 [248];
  char local_3b8 [8];
  char bodybuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *itr;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_file_handle *dbfile;
  int r;
  int n;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_4b0,0xf8);
  fconfig.wal_flush_before_commit = true;
  fdb_get_default_kvs_config();
  kvs_config._0_8_ = in_stack_fffffffffffffb40;
  kvs_config.custom_cmp = (fdb_custom_cmp_variable)in_stack_fffffffffffffb48;
  fdb_open((fdb_file_handle **)bodybuf._168_8_,(char *)bodybuf._160_8_,(fdb_config *)bodybuf._152_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->handle,(fdb_kvs_config *)0x1064e2
            );
  fVar1 = fdb_set_log_callback(db2,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x15e);
    iterator_with_concurrent_updates_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x15e,"void iterator_with_concurrent_updates_test()");
    }
  }
  fdb_kvs_open_default
            (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->handle,(fdb_kvs_config *)0x106576
            );
  fVar1 = fdb_set_log_callback(db3,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x163);
    iterator_with_concurrent_updates_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x163,"void iterator_with_concurrent_updates_test()");
    }
  }
  fdb_kvs_open_default
            (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->handle,(fdb_kvs_config *)0x10660a
            );
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)itr,logCallbackFunc,"iterator_concurrent_update_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x168);
    iterator_with_concurrent_updates_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x168,"void iterator_with_concurrent_updates_test()");
    }
  }
  for (r = 0; r < 10; r = r + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)r);
    sprintf(local_3b8,"body%d",(ulong)(uint)r);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x10671f;
    metalen = strlen(local_3b8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (size_t)in_stack_fffffffffffffac8,meta,metalen,(void *)0x106750,
                   in_stack_fffffffffffffaf0);
    fdb_set(db2,*(fdb_doc **)(&stack0xfffffffffffffac8 + (long)r * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffac8,'\0');
  fdb_iterator_init(db3,(fdb_iterator **)&fconfig.num_blocks_readahead,(void *)0x0,0,(void *)0x0,0,0
                   );
  dbfile._4_4_ = 0;
  do {
    fVar1 = fdb_iterator_get(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x179);
      iterator_with_concurrent_updates_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x179,"void iterator_with_concurrent_updates_test()");
      }
    }
    iVar2 = memcmp(pvRam0000000000000020,
                   *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)dbfile._4_4_ * 8) + 0x20),
                   sRam0000000000000000);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)dbfile._4_4_ * 8) + 0x20),
              pvRam0000000000000020,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x17a);
      iterator_with_concurrent_updates_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x17a,"void iterator_with_concurrent_updates_test()");
    }
    iVar2 = memcmp(pvRam0000000000000040,
                   *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)dbfile._4_4_ * 8) + 0x40),
                   sRam0000000000000010);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)dbfile._4_4_ * 8) + 0x40),
              pvRam0000000000000040,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x17b);
      iterator_with_concurrent_updates_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x17b,"void iterator_with_concurrent_updates_test()");
    }
    dbfile._4_4_ = dbfile._4_4_ + 1;
    fdb_doc_free((fdb_doc *)0x10698c);
    fVar1 = fdb_iterator_next(in_stack_fffffffffffffac8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(in_stack_fffffffffffffad8);
  if (dbfile._4_4_ != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x181);
    iterator_with_concurrent_updates_test::__test_pass = 0;
    if (dbfile._4_4_ != 10) {
      __assert_fail("r == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x181,"void iterator_with_concurrent_updates_test()");
    }
  }
  fdb_iterator_sequence_init
            ((fdb_kvs_handle *)itr,(fdb_iterator **)&fconfig.num_blocks_readahead,0,0,0);
  dbfile._4_4_ = 0;
  do {
    fVar1 = fdb_iterator_get(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x188);
      iterator_with_concurrent_updates_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x188,"void iterator_with_concurrent_updates_test()");
      }
    }
    dbfile._4_4_ = dbfile._4_4_ + 1;
    if (lRam0000000000000028 != dbfile._4_4_) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x18a);
      iterator_with_concurrent_updates_test::__test_pass = 0;
      if (lRam0000000000000028 != dbfile._4_4_) {
        __assert_fail("rdoc->seqnum == (fdb_seqnum_t)r",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x18a,"void iterator_with_concurrent_updates_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x106b44);
    fVar1 = fdb_iterator_next(in_stack_fffffffffffffac8);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fdb_iterator_close(in_stack_fffffffffffffad8);
  if (dbfile._4_4_ != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,399);
    iterator_with_concurrent_updates_test::__test_pass = 0;
    if (dbfile._4_4_ != 10) {
      __assert_fail("r == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,399,"void iterator_with_concurrent_updates_test()");
    }
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffac8);
  for (r = 0; r < 10; r = r + 1) {
    fdb_doc_free((fdb_doc *)0x106bfd);
  }
  fdb_shutdown();
  memleak_end();
  if (iterator_with_concurrent_updates_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","iterator with concurrent updates test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","iterator with concurrent updates test");
  }
  return;
}

Assistant:

void iterator_with_concurrent_updates_test()
{
    // unit test for MB-12287
    TEST_INIT();
    memleak_start();

    int i, n=10;
    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_iterator *itr;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    char keybuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db1, db2, db3 on the same file
    fconfig = fdb_get_default_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    fdb_open(&dbfile, "./iterator_test1", &fconfig);

    fdb_kvs_open_default(dbfile, &db1, &kvs_config);
    status = fdb_set_log_callback(db1, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db2, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db3, &kvs_config);
    status = fdb_set_log_callback(db3, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs using db1
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf), NULL, 0,
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // create an iterator using db2
    fdb_iterator_init(db2, &itr, NULL, 0, NULL, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[r]->key, rdoc->keylen);
        TEST_CMP(rdoc->body, doc[r]->body, rdoc->bodylen);
        r++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    // same for sequence number
    fdb_iterator_sequence_init(db3, &itr, 0, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        r++;
        TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)r);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator with concurrent updates test");
}